

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O0

bool __thiscall higan::HttpRequest::SetMethod(HttpRequest *this,char *begin,char *end)

{
  bool bVar1;
  allocator<char> local_49;
  undefined1 local_48 [8];
  string method;
  char *end_local;
  char *begin_local;
  HttpRequest *this_local;
  
  method.field_2._8_8_ = end;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<char_const*,void>((string *)local_48,begin,end,&local_49);
  std::allocator<char>::~allocator(&local_49);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,"GET");
  if (bVar1) {
    this->method_ = HTTP_REQUEST_GET;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_48,"POST");
    if (bVar1) {
      this->method_ = HTTP_REQUEST_POST;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"PUT");
      if (bVar1) {
        this->method_ = HTTP_REQUEST_PUT;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_48,"DELETE");
        if (!bVar1) {
          this_local._7_1_ = false;
          goto LAB_0015a909;
        }
        this->method_ = HTTP_REQUEST_DELETE;
      }
    }
  }
  this_local._7_1_ = true;
LAB_0015a909:
  std::__cxx11::string::~string((string *)local_48);
  return this_local._7_1_;
}

Assistant:

bool HttpRequest::SetMethod(const char* begin, const char* end)
{
	std::string method(begin, end);

	if (method == "GET")
	{
		method_ = HTTP_REQUEST_GET;
	}
	else if (method == "POST")
	{
		method_ = HTTP_REQUEST_POST;
	}
	else if (method == "PUT")
	{
		method_ = HTTP_REQUEST_PUT;
	}
	else if (method == "DELETE")
	{
		method_ = HTTP_REQUEST_DELETE;
	}
	else
	{
		return false;
	}
	return true;
}